

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O0

void google::anon_unknown_0::DumpTimeInfo(void)

{
  undefined *puVar1;
  int iVar2;
  uint64 number;
  undefined1 local_130 [8];
  MinimalFormatter formatter;
  char buf [256];
  time_t time_in_sec;
  
  number = time((time_t *)0x0);
  MinimalFormatter::MinimalFormatter((MinimalFormatter *)local_130,(char *)&formatter.end_,0x100);
  MinimalFormatter::AppendString((MinimalFormatter *)local_130,"*** Aborted at ");
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_130,number,10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_130," (unix time)");
  MinimalFormatter::AppendString((MinimalFormatter *)local_130," try \"date -d @");
  MinimalFormatter::AppendUint64((MinimalFormatter *)local_130,number,10);
  MinimalFormatter::AppendString((MinimalFormatter *)local_130,"\" if you are using GNU date ***\n")
  ;
  puVar1 = (anonymous_namespace)::g_failure_writer;
  iVar2 = MinimalFormatter::num_bytes_written((MinimalFormatter *)local_130);
  (*(code *)puVar1)(&formatter.end_,iVar2);
  return;
}

Assistant:

void DumpTimeInfo() {
  time_t time_in_sec = time(NULL);
  char buf[256];  // Big enough for time info.
  MinimalFormatter formatter(buf, sizeof(buf));
  formatter.AppendString("*** Aborted at ");
  formatter.AppendUint64(time_in_sec, 10);
  formatter.AppendString(" (unix time)");
  formatter.AppendString(" try \"date -d @");
  formatter.AppendUint64(time_in_sec, 10);
  formatter.AppendString("\" if you are using GNU date ***\n");
  g_failure_writer(buf, formatter.num_bytes_written());
}